

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O0

UnicodeString * __thiscall icu_63::UnicodeString::setToUTF8(UnicodeString *this,StringPiece utf8)

{
  UBool UVar1;
  int32_t destCapacity;
  char16_t *dest;
  char *src;
  UErrorCode local_38;
  int32_t local_34;
  UErrorCode errorCode;
  int32_t length16;
  UChar *utf16;
  int32_t capacity;
  int32_t length;
  UnicodeString *this_local;
  StringPiece utf8_local;
  
  this_local = (UnicodeString *)utf8.ptr_;
  utf8_local.ptr_._0_4_ = utf8.length_;
  _capacity = this;
  unBogus(this);
  utf16._4_4_ = StringPiece::length((StringPiece *)&this_local);
  if (utf16._4_4_ < 0x1c) {
    utf16._0_4_ = 0x1b;
  }
  else {
    utf16._0_4_ = utf16._4_4_ + 1;
  }
  dest = getBuffer(this,(int)utf16);
  local_38 = U_ZERO_ERROR;
  _errorCode = dest;
  destCapacity = getCapacity(this);
  src = StringPiece::data((StringPiece *)&this_local);
  u_strFromUTF8WithSub_63
            (dest,destCapacity,&local_34,src,utf16._4_4_,0xfffd,(int32_t *)0x0,&local_38);
  releaseBuffer(this,local_34);
  UVar1 = ::U_FAILURE(local_38);
  if (UVar1 != '\0') {
    setToBogus(this);
  }
  return this;
}

Assistant:

UnicodeString &UnicodeString::setToUTF8(StringPiece utf8) {
  unBogus();
  int32_t length = utf8.length();
  int32_t capacity;
  // The UTF-16 string will be at most as long as the UTF-8 string.
  if(length <= US_STACKBUF_SIZE) {
    capacity = US_STACKBUF_SIZE;
  } else {
    capacity = length + 1;  // +1 for the terminating NUL.
  }
  UChar *utf16 = getBuffer(capacity);
  int32_t length16;
  UErrorCode errorCode = U_ZERO_ERROR;
  u_strFromUTF8WithSub(utf16, getCapacity(), &length16,
      utf8.data(), length,
      0xfffd,  // Substitution character.
      NULL,    // Don't care about number of substitutions.
      &errorCode);
  releaseBuffer(length16);
  if(U_FAILURE(errorCode)) {
    setToBogus();
  }
  return *this;
}